

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::ItemAdd(ImRect *bb,ImGuiID id,ImRect *nav_bb_arg)

{
  int *piVar1;
  ImRect *pIVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ImGuiID IVar6;
  uint uVar7;
  ImGuiNavLayer IVar8;
  ImGuiWindow *pIVar9;
  ImGuiWindow *pIVar10;
  ImVec2 IVar11;
  ImVec2 IVar12;
  ImGuiContext *pIVar13;
  bool bVar14;
  bool bVar15;
  undefined4 in_register_00000034;
  ImGuiNavMoveResult *result;
  ImGuiContext *g;
  ImGui *this;
  ImVec2 IVar16;
  ImVec2 IVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  pIVar13 = GImGui;
  result = (ImGuiNavMoveResult *)CONCAT44(in_register_00000034,id);
  pIVar9 = GImGui->CurrentWindow;
  if (id != 0) {
    piVar1 = &(pIVar9->DC).NavLayerActiveMaskNext;
    *piVar1 = *piVar1 | (pIVar9->DC).NavLayerCurrentMask;
    IVar6 = pIVar13->NavId;
    if ((((IVar6 == id) || (pIVar13->NavAnyRequest == true)) &&
        (pIVar10 = pIVar13->NavWindow, pIVar10->RootWindowForNav == pIVar9->RootWindowForNav)) &&
       ((pIVar9 == pIVar10 || (((uint)(pIVar10->Flags | pIVar9->Flags) >> 0x17 & 1) != 0)))) {
      if (nav_bb_arg == (ImRect *)0x0) {
        nav_bb_arg = bb;
      }
      uVar7 = (pIVar9->DC).ItemFlags;
      fVar22 = (pIVar9->Pos).x;
      fVar20 = (nav_bb_arg->Min).x - fVar22;
      fVar23 = (pIVar9->Pos).y;
      fVar21 = (nav_bb_arg->Min).y - fVar23;
      fVar22 = (nav_bb_arg->Max).x - fVar22;
      fVar23 = (nav_bb_arg->Max).y - fVar23;
      if ((pIVar13->NavInitRequest == true) &&
         (result = (ImGuiNavMoveResult *)(ulong)pIVar13->NavLayer,
         pIVar13->NavLayer == (pIVar9->DC).NavLayerCurrent)) {
        if ((uVar7 & 0x10) == 0) {
          pIVar13->NavInitResultId = id;
          IVar16.y = fVar21;
          IVar16.x = fVar20;
          IVar11.y = fVar23;
          IVar11.x = fVar22;
          (pIVar13->NavInitResultRectRel).Min = IVar16;
          (pIVar13->NavInitResultRectRel).Max = IVar11;
          pIVar13->NavInitRequest = false;
          if (pIVar13->NavMoveRequest == false) {
            pIVar13->NavAnyRequest = false;
          }
          else {
            pIVar13->NavAnyRequest = true;
          }
        }
        else if (pIVar13->NavInitResultId == 0) {
          pIVar13->NavInitResultId = id;
          IVar17.y = fVar21;
          IVar17.x = fVar20;
          IVar12.y = fVar23;
          IVar12.x = fVar22;
          (pIVar13->NavInitResultRectRel).Min = IVar17;
          (pIVar13->NavInitResultRectRel).Max = IVar12;
        }
      }
      if (((IVar6 != id) || ((pIVar13->NavMoveRequestFlags & 0x10) != 0)) && ((uVar7 & 0xc) == 0)) {
        this = (ImGui *)&pIVar13->NavMoveResultOther;
        if (pIVar9 == pIVar10) {
          this = (ImGui *)&pIVar13->NavMoveResultLocal;
        }
        if ((pIVar13->NavMoveRequest == true) &&
           (bVar14 = NavScoreItem(this,result,*nav_bb_arg), bVar14)) {
          *(ImGuiWindow **)this = pIVar9;
          *(ImGuiID *)(this + 8) = id;
          *(ImGuiID *)(this + 0xc) = (pIVar9->DC).NavFocusScopeIdCurrent;
          *(float *)(this + 0x1c) = fVar20;
          *(float *)(this + 0x20) = fVar21;
          *(float *)(this + 0x24) = fVar22;
          *(float *)(this + 0x28) = fVar23;
        }
        if ((pIVar13->NavMoveRequestFlags & 0x20) != 0) {
          fVar3 = (nav_bb_arg->Min).y;
          fVar18 = (pIVar9->ClipRect).Max.y;
          if (fVar3 < fVar18) {
            fVar4 = (nav_bb_arg->Max).y;
            fVar5 = (pIVar9->ClipRect).Min.y;
            if (((fVar5 < fVar4) &&
                (fVar19 = (pIVar9->ClipRect).Max.x,
                (nav_bb_arg->Min).x <= fVar19 && fVar19 != (nav_bb_arg->Min).x)) &&
               (fVar19 = (nav_bb_arg->Max).x,
               (pIVar9->ClipRect).Min.x <= fVar19 && fVar19 != (pIVar9->ClipRect).Min.x)) {
              fVar19 = fVar18;
              if (fVar4 <= fVar18) {
                fVar19 = fVar4;
              }
              if (fVar3 <= fVar18) {
                fVar18 = fVar3;
              }
              if (((fVar4 - fVar3) * 0.7 <=
                   (float)(-(uint)(fVar4 < fVar5) & (uint)fVar5 |
                          ~-(uint)(fVar4 < fVar5) & (uint)fVar19) -
                   (float)(-(uint)(fVar3 < fVar5) & (uint)fVar5 |
                          ~-(uint)(fVar3 < fVar5) & (uint)fVar18)) &&
                 (bVar14 = NavScoreItem((ImGui *)&pIVar13->NavMoveResultLocalVisibleSet,result,
                                        *nav_bb_arg), bVar14)) {
                (pIVar13->NavMoveResultLocalVisibleSet).Window = pIVar9;
                (pIVar13->NavMoveResultLocalVisibleSet).ID = id;
                (pIVar13->NavMoveResultLocalVisibleSet).FocusScopeId =
                     (pIVar9->DC).NavFocusScopeIdCurrent;
                (pIVar13->NavMoveResultLocalVisibleSet).RectRel.Min.x = fVar20;
                (pIVar13->NavMoveResultLocalVisibleSet).RectRel.Min.y = fVar21;
                (pIVar13->NavMoveResultLocalVisibleSet).RectRel.Max.x = fVar22;
                (pIVar13->NavMoveResultLocalVisibleSet).RectRel.Max.y = fVar23;
              }
            }
          }
        }
      }
      if (pIVar13->NavId == id) {
        pIVar13->NavWindow = pIVar9;
        IVar8 = (pIVar9->DC).NavLayerCurrent;
        pIVar13->NavLayer = IVar8;
        pIVar13->NavFocusScopeId = (pIVar9->DC).NavFocusScopeIdCurrent;
        pIVar13->NavIdIsAlive = true;
        pIVar13->NavIdTabCounter = (pIVar9->DC).FocusCounterTabStop;
        pIVar2 = pIVar9->NavRectRel + IVar8;
        (pIVar2->Min).x = fVar20;
        (pIVar2->Min).y = fVar21;
        (pIVar2->Max).x = fVar22;
        (pIVar2->Max).y = fVar23;
      }
    }
  }
  (pIVar9->DC).LastItemId = id;
  IVar12 = bb->Max;
  (pIVar9->DC).LastItemRect.Min = bb->Min;
  (pIVar9->DC).LastItemRect.Max = IVar12;
  (pIVar9->DC).LastItemStatusFlags = 0;
  (pIVar13->NextItemData).Flags = 0;
  bVar14 = IsClippedEx(bb,id,false);
  if ((!bVar14) && (bVar15 = IsMouseHoveringRect(&bb->Min,&bb->Max,true), bVar15)) {
    (pIVar9->DC).LastItemStatusFlags = 1;
  }
  return !bVar14;
}

Assistant:

bool ImGui::ItemAdd(const ImRect& bb, ImGuiID id, const ImRect* nav_bb_arg)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (id != 0)
    {
        // Navigation processing runs prior to clipping early-out
        //  (a) So that NavInitRequest can be honored, for newly opened windows to select a default widget
        //  (b) So that we can scroll up/down past clipped items. This adds a small O(N) cost to regular navigation requests
        //      unfortunately, but it is still limited to one window. It may not scale very well for windows with ten of
        //      thousands of item, but at least NavMoveRequest is only set on user interaction, aka maximum once a frame.
        //      We could early out with "if (is_clipped && !g.NavInitRequest) return false;" but when we wouldn't be able
        //      to reach unclipped widgets. This would work if user had explicit scrolling control (e.g. mapped on a stick).
        // We intentionally don't check if g.NavWindow != NULL because g.NavAnyRequest should only be set when it is non null.
        // If we crash on a NULL g.NavWindow we need to fix the bug elsewhere.
        window->DC.NavLayerActiveMaskNext |= window->DC.NavLayerCurrentMask;
        if (g.NavId == id || g.NavAnyRequest)
            if (g.NavWindow->RootWindowForNav == window->RootWindowForNav)
                if (window == g.NavWindow || ((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened))
                    NavProcessItem(window, nav_bb_arg ? *nav_bb_arg : bb, id);

        // [DEBUG] Item Picker tool, when enabling the "extended" version we perform the check in ItemAdd()
#ifdef IMGUI_DEBUG_TOOL_ITEM_PICKER_EX
        if (id == g.DebugItemPickerBreakId)
        {
            IM_DEBUG_BREAK();
            g.DebugItemPickerBreakId = 0;
        }
#endif
    }

    window->DC.LastItemId = id;
    window->DC.LastItemRect = bb;
    window->DC.LastItemStatusFlags = ImGuiItemStatusFlags_None;
    g.NextItemData.Flags = ImGuiNextItemDataFlags_None;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0)
        IMGUI_TEST_ENGINE_ITEM_ADD(nav_bb_arg ? *nav_bb_arg : bb, id);
#endif

    // Clipping test
    const bool is_clipped = IsClippedEx(bb, id, false);
    if (is_clipped)
        return false;
    //if (g.IO.KeyAlt) window->DrawList->AddRect(bb.Min, bb.Max, IM_COL32(255,255,0,120)); // [DEBUG]

    // We need to calculate this now to take account of the current clipping rectangle (as items like Selectable may change them)
    if (IsMouseHoveringRect(bb.Min, bb.Max))
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_HoveredRect;
    return true;
}